

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::UninterpretedOption_NamePart::InternalSerializeWithCachedSizesToArray
          (UninterpretedOption_NamePart *this,uint8 *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  uint32 uVar2;
  uint8 *target_00;
  Container *target_01;
  undefined8 in_RDX;
  EpsCopyOutputStream *in_RSI;
  UninterpretedOption_NamePart *in_RDI;
  uint32 cached_has_bits;
  Operation in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  EpsCopyOutputStream *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff60;
  uint uVar3;
  EpsCopyOutputStream *stream_00;
  InternalMetadataWithArena *pIVar4;
  
  uVar2 = (uint32)((ulong)in_RDX >> 0x20);
  uVar3 = (in_RDI->_has_bits_).has_bits_[0];
  if ((uVar3 & 1) != 0) {
    _internal_name_part_abi_cxx11_((UninterpretedOption_NamePart *)0x533770);
    std::__cxx11::string::data();
    _internal_name_part_abi_cxx11_((UninterpretedOption_NamePart *)0x533787);
    std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              ((char *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38
               ,(char *)0x5337a7);
    _internal_name_part_abi_cxx11_((UninterpretedOption_NamePart *)0x5337bb);
    in_RSI = (EpsCopyOutputStream *)
             io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (in_RSI,uVar2,(string *)CONCAT44(uVar3,in_stack_ffffffffffffff60),
                        (uint8 *)in_RDI);
  }
  if ((uVar3 & 2) != 0) {
    io::EpsCopyOutputStream::EnsureSpace
              (in_stack_ffffffffffffff40,
               (uint8 **)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    bVar1 = _internal_is_extension(in_RDI);
    uVar2 = internal::WireFormatLite::MakeTag(2,WIRETYPE_VARINT);
    target_00 = io::CodedOutputStream::WriteVarint32ToArray(uVar2,(uint8 *)in_RSI);
    in_RSI = (EpsCopyOutputStream *)
             io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,target_00);
  }
  if (((uint)(in_RDI->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    stream_00 = (EpsCopyOutputStream *)&in_RDI->_internal_metadata_;
    pIVar4 = (InternalMetadataWithArena *)stream_00;
    if (((uint)(((InternalMetadataWithArena *)stream_00)->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      target_01 = internal::
                  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                  ::
                  PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                            ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                              *)stream_00);
    }
    else {
      target_01 = (Container *)internal::InternalMetadataWithArena::default_instance();
    }
    in_RSI = (EpsCopyOutputStream *)
             internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)pIVar4,(uint8 *)target_01,stream_00);
  }
  return (uint8 *)in_RSI;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* UninterpretedOption_NamePart::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.UninterpretedOption.NamePart)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // required string name_part = 1;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_name_part().data(), static_cast<int>(this->_internal_name_part().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.UninterpretedOption.NamePart.name_part");
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_name_part(), target);
  }

  // required bool is_extension = 2;
  if (cached_has_bits & 0x00000002u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(2, this->_internal_is_extension(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.UninterpretedOption.NamePart)
  return target;
}